

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

nh_msgtype_rules * copy_msgtype_rules(nh_msgtype_rules *in)

{
  uint uVar1;
  nh_msgtype_rule *pnVar2;
  uint size;
  nh_msgtype_rules *out;
  nh_msgtype_rules *in_local;
  
  if ((in == (nh_msgtype_rules *)0x0) || (in->num_rules == 0)) {
    in_local = (nh_msgtype_rules *)0x0;
  }
  else {
    in_local = (nh_msgtype_rules *)malloc(0x10);
    if (in_local == (nh_msgtype_rules *)0x0) {
      in_local = (nh_msgtype_rules *)0x0;
    }
    else {
      in_local->num_rules = in->num_rules;
      uVar1 = in_local->num_rules * 0x7c;
      pnVar2 = (nh_msgtype_rule *)malloc((ulong)uVar1);
      in_local->rules = pnVar2;
      if (in_local->rules == (nh_msgtype_rule *)0x0) {
        free(in_local);
        in_local = (nh_msgtype_rules *)0x0;
      }
      else {
        memcpy(in_local->rules,in->rules,(ulong)uVar1);
      }
    }
  }
  return in_local;
}

Assistant:

static struct nh_msgtype_rules *copy_msgtype_rules(const struct nh_msgtype_rules *in)
{
    struct nh_msgtype_rules *out;
    unsigned int size;

    if (!in || !in->num_rules)
	return NULL;

    out = malloc(sizeof(struct nh_msgtype_rules));
    if (!out)
	return NULL;

    out->num_rules = in->num_rules;
    size = out->num_rules * sizeof(struct nh_msgtype_rule);
    out->rules = malloc(size);
    if (!out->rules) {
	free(out);
	return NULL;
    }
    memcpy(out->rules, in->rules, size);

    return out;
}